

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifySolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  type_conflict5 tVar2;
  SPxOut *pSVar3;
  SPxOut *pSVar4;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_230;
  cpp_dec_float<50U,_int,_void> local_1f8;
  Real local_1c0;
  Real local_1b8;
  Real local_1b0;
  Real local_1a8;
  cpp_dec_float<50U,_int,_void> local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar4 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar3 = soplex::operator<<(pSVar4," --- verifying computed solution");
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_68,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1a0,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1f8,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_230,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_268,0,(type *)0x0);
  getBoundViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1a0,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_68);
  getRowViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,
                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_68);
  getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68);
  getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_268,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_68);
  local_1a8 = Tolerances::floatingPointFeastol
                        ((this->_solver).
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  tVar2 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1a0,&local_1a8);
  if (!tVar2) {
    local_1b0 = Tolerances::floatingPointFeastol
                          ((this->_solver).
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1f8,&local_1b0);
    if (!tVar2) {
      local_1b8 = Tolerances::floatingPointOpttol
                            ((this->_solver).
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
      tVar2 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_230,&local_1b8);
      if (!tVar2) {
        local_1c0 = Tolerances::floatingPointOpttol
                              ((this->_solver).
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_268,&local_1c0);
        if (!tVar2) {
          return;
        }
      }
    }
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_002aee10;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    pSVar3 = soplex::operator<<(pSVar4,"bound violation: ");
    local_a8.m_backend.data._M_elems[0] = local_1a0.data._M_elems[0];
    local_a8.m_backend.data._M_elems[1] = local_1a0.data._M_elems[1];
    local_a8.m_backend.data._M_elems[2] = local_1a0.data._M_elems[2];
    local_a8.m_backend.data._M_elems[3] = local_1a0.data._M_elems[3];
    local_a8.m_backend.data._M_elems[4] = local_1a0.data._M_elems[4];
    local_a8.m_backend.data._M_elems[5] = local_1a0.data._M_elems[5];
    local_a8.m_backend.data._M_elems[6] = local_1a0.data._M_elems[6];
    local_a8.m_backend.data._M_elems[7] = local_1a0.data._M_elems[7];
    local_a8.m_backend.data._M_elems[8] = local_1a0.data._M_elems[8];
    local_a8.m_backend.data._M_elems[9] = local_1a0.data._M_elems[9];
    local_a8.m_backend.exp = local_1a0.exp;
    local_a8.m_backend.neg = local_1a0.neg;
    local_a8.m_backend.fpclass = local_1a0.fpclass;
    local_a8.m_backend.prec_elem = local_1a0.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_a8);
    pSVar3 = soplex::operator<<(pSVar3,", row violation: ");
    local_e8.m_backend.data._M_elems[0] = local_1f8.data._M_elems[0];
    local_e8.m_backend.data._M_elems[1] = local_1f8.data._M_elems[1];
    local_e8.m_backend.data._M_elems[2] = local_1f8.data._M_elems[2];
    local_e8.m_backend.data._M_elems[3] = local_1f8.data._M_elems[3];
    local_e8.m_backend.data._M_elems[4] = local_1f8.data._M_elems[4];
    local_e8.m_backend.data._M_elems[5] = local_1f8.data._M_elems[5];
    local_e8.m_backend.data._M_elems[6] = local_1f8.data._M_elems[6];
    local_e8.m_backend.data._M_elems[7] = local_1f8.data._M_elems[7];
    local_e8.m_backend.data._M_elems[8] = local_1f8.data._M_elems[8];
    local_e8.m_backend.data._M_elems[9] = local_1f8.data._M_elems[9];
    local_e8.m_backend.exp = local_1f8.exp;
    local_e8.m_backend.neg = local_1f8.neg;
    local_e8.m_backend.fpclass = local_1f8.fpclass;
    local_e8.m_backend.prec_elem = local_1f8.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_e8);
    pSVar3 = soplex::operator<<(pSVar3,", dual violation: ");
    local_128.m_backend.data._M_elems[0] = local_230.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_230.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_230.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_230.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = local_230.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_230.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = local_230.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = local_230.data._M_elems[7];
    local_128.m_backend.data._M_elems[8] = local_230.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = local_230.data._M_elems[9];
    local_128.m_backend.exp = local_230.exp;
    local_128.m_backend.neg = local_230.neg;
    local_128.m_backend.fpclass = local_230.fpclass;
    local_128.m_backend.prec_elem = local_230.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_128);
    pSVar3 = soplex::operator<<(pSVar3,", redcost violation: ");
    local_168.m_backend.data._M_elems[0] = local_268.data._M_elems[0];
    local_168.m_backend.data._M_elems[1] = local_268.data._M_elems[1];
    local_168.m_backend.data._M_elems[2] = local_268.data._M_elems[2];
    local_168.m_backend.data._M_elems[3] = local_268.data._M_elems[3];
    local_168.m_backend.data._M_elems[4] = local_268.data._M_elems[4];
    local_168.m_backend.data._M_elems[5] = local_268.data._M_elems[5];
    local_168.m_backend.data._M_elems[6] = local_268.data._M_elems[6];
    local_168.m_backend.data._M_elems[7] = local_268.data._M_elems[7];
    local_168.m_backend.data._M_elems[8] = local_268.data._M_elems[8];
    local_168.m_backend.data._M_elems[9] = local_268.data._M_elems[9];
    local_168.m_backend.exp = local_268.exp;
    local_168.m_backend.neg = local_268.neg;
    local_168.m_backend.fpclass = local_268.fpclass;
    local_168.m_backend.prec_elem = local_268.prec_elem;
    pSVar3 = soplex::operator<<(pSVar3,&local_168);
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar4 = soplex::operator<<(pSVar4,
                              " --- detected violations in original problem space -- solve again without presolving/scaling"
                             );
  std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
  (this->spxout).m_verbosity = VVar1;
LAB_002aee10:
  if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}